

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

shared_ptr<kratos::Port> __thiscall
kratos::FunctionStmtBlock::input(FunctionStmtBlock *this,string *name,uint32_t width,bool is_signed)

{
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  byte in_R8B;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_bool>
  pVar1;
  shared_ptr<kratos::Port> sVar2;
  bool local_34 [4];
  PortType local_30;
  undefined1 local_2c [15];
  bool is_signed_local;
  uint32_t width_local;
  string *name_local;
  FunctionStmtBlock *this_local;
  shared_ptr<kratos::Port> *p;
  
  register0x00000010 =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CONCAT44(in_register_00000014,width);
  local_2c._8_4_ = (undefined4)CONCAT71(in_register_00000009,is_signed);
  local_2c[7] = in_R8B & 1;
  local_2c[6] = 0;
  local_2c._0_4_ = 0;
  local_30 = Clock;
  local_34[0] = false;
  local_34[1] = false;
  local_34[2] = false;
  local_34[3] = false;
  name_local = name;
  this_local = this;
  std::
  make_shared<kratos::Port,kratos::Generator*&,kratos::PortDirection,std::__cxx11::string_const&,unsigned_int&,int,kratos::PortType,bool&>
            ((Generator **)this,(PortDirection *)(name + 7),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c,
             (uint *)register0x00000010,(int *)(local_2c + 8),&local_30,local_34);
  pVar1 = std::
          map<std::__cxx11::string,std::shared_ptr<kratos::Port>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>>>
          ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::Port>&>
                    ((map<std::__cxx11::string,std::shared_ptr<kratos::Port>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>>>
                      *)&name[8]._M_string_length,stack0xffffffffffffffe0,
                     (shared_ptr<kratos::Port> *)this);
  sVar2.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = pVar1._8_8_
  ;
  sVar2.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Port>)
         sVar2.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Port> FunctionStmtBlock::input(const std::string &name, uint32_t width,
                                               bool is_signed) {
    auto p = std::make_shared<Port>(parent_, PortDirection::In, name, width, 1, PortType::Data,
                                    is_signed);
    ports_.emplace(name, p);
    return p;
}